

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O2

void __thiscall Assimp::MD5Importer::LoadMD5MeshFile(MD5Importer *this)

{
  char *__s;
  aiString *pInput;
  aiVertexWeight **ppaVar1;
  int *piVar2;
  float fVar3;
  float fVar4;
  IOSystem *pIVar5;
  aiScene *paVar6;
  pointer pWVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  size_type sVar20;
  uint m;
  int iVar21;
  uint uVar22;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  aiNode *paVar23;
  aiNode **ppaVar24;
  pointer pMVar25;
  aiMesh **ppaVar26;
  aiMaterial **ppaVar27;
  uint *puVar28;
  ulong uVar29;
  aiMesh *this_00;
  aiVector3D *paVar30;
  void *__s_00;
  pointer pVVar31;
  aiBone **ppaVar32;
  aiBone *this_01;
  aiVertexWeight *paVar33;
  long lVar34;
  Logger *pLVar35;
  ulong *puVar36;
  aiFace *paVar37;
  aiMaterial *this_02;
  char *pcVar38;
  DeadlyImportError *this_03;
  uint c;
  uint uVar39;
  aiFace *paVar40;
  long lVar41;
  pointer pBVar42;
  aiMesh *this_04;
  ulong uVar43;
  pointer pBVar44;
  float fVar45;
  aiVector3t<float> aVar46;
  uint local_93c;
  uint local_924;
  aiVector3t<float> *local_918;
  MD5MeshParser meshParser;
  string name;
  string pFile;
  MD5Parser parser;
  aiString temp;
  aiVector3t<float> local_438 [86];
  IOStream *file;
  
  std::operator+(&pFile,&this->mFile,"md5mesh");
  pIVar5 = this->pIOHandler;
  std::__cxx11::string::string((string *)&temp,"rb",(allocator *)local_438);
  iVar21 = (*pIVar5->_vptr_IOSystem[4])(pIVar5,pFile._M_dataplus._M_p,temp._0_8_);
  file = (IOStream *)CONCAT44(extraout_var,iVar21);
  std::__cxx11::string::~string((string *)&temp);
  if (file != (IOStream *)0x0) {
    iVar21 = (*file->_vptr_IOStream[6])(file);
    if (CONCAT44(extraout_var_00,iVar21) != 0) {
      this->bHadMD5Mesh = true;
      LoadFileIntoMemory(this,file);
      MD5::MD5Parser::MD5Parser(&parser,this->mBuffer,this->fileSize);
      MD5::MD5MeshParser::MD5MeshParser(&meshParser,&parser.mSections);
      paVar23 = (aiNode *)operator_new(0x478);
      std::__cxx11::string::string((string *)&temp,"<MD5_Root>",(allocator *)local_438);
      aiNode::aiNode(paVar23,(string *)&temp);
      this->pScene->mRootNode = paVar23;
      std::__cxx11::string::~string((string *)&temp);
      this->pScene->mRootNode->mNumChildren = 2;
      ppaVar24 = (aiNode **)operator_new__(0x10);
      this->pScene->mRootNode->mChildren = ppaVar24;
      paVar23 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar23);
      this->pScene->mRootNode->mChildren[1] = paVar23;
      aiString::Set((aiString *)paVar23,"<MD5_Hierarchy>");
      paVar23->mParent = this->pScene->mRootNode;
      AttachChilds_Mesh(this,-1,paVar23,&meshParser.mJoints);
      paVar23 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar23);
      *this->pScene->mRootNode->mChildren = paVar23;
      aiString::Set((aiString *)paVar23,"<MD5_Mesh>");
      paVar23->mParent = this->pScene->mRootNode;
      for (pMVar25 = meshParser.mMeshes.
                     super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pMVar25 !=
          meshParser.mMeshes.
          super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>._M_impl.
          super__Vector_impl_data._M_finish; pMVar25 = pMVar25 + 1) {
        if (((pMVar25->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
             super__Vector_impl_data._M_start !=
             (pMVar25->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
             super__Vector_impl_data._M_finish) &&
           ((pMVar25->mVertices).
            super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (pMVar25->mVertices).
            super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>.
            _M_impl.super__Vector_impl_data._M_finish)) {
          puVar28 = &this->pScene->mNumMaterials;
          *puVar28 = *puVar28 + 1;
        }
      }
      this->pScene->mNumMeshes = this->pScene->mNumMaterials;
      paVar6 = this->pScene;
      ppaVar26 = (aiMesh **)operator_new__((ulong)paVar6->mNumMeshes << 3);
      paVar6->mMeshes = ppaVar26;
      paVar6 = this->pScene;
      ppaVar27 = (aiMaterial **)operator_new__((ulong)paVar6->mNumMeshes << 3);
      paVar6->mMaterials = ppaVar27;
      uVar22 = this->pScene->mNumMeshes;
      uVar43 = (ulong)uVar22;
      paVar23->mNumMeshes = uVar22;
      puVar28 = (uint *)operator_new__(uVar43 << 2);
      paVar23->mMeshes = puVar28;
      for (uVar29 = 0; uVar29 < uVar43; uVar29 = uVar29 + 1) {
        paVar23->mMeshes[uVar29] = (uint)uVar29;
        uVar43 = (ulong)paVar23->mNumMeshes;
      }
      local_924 = 0;
      pMVar25 = meshParser.mMeshes.
                super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>.
                _M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        if (pMVar25 ==
            meshParser.mMeshes.
            super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>.
            _M_impl.super__Vector_impl_data._M_finish) break;
        if (((pMVar25->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
             super__Vector_impl_data._M_start !=
             (pMVar25->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
             super__Vector_impl_data._M_finish) &&
           ((pMVar25->mVertices).
            super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (pMVar25->mVertices).
            super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>.
            _M_impl.super__Vector_impl_data._M_finish)) {
          this_00 = (aiMesh *)operator_new(0x520);
          this_04 = this_00;
          aiMesh::aiMesh(this_00);
          this->pScene->mMeshes[local_924] = this_00;
          this_00->mPrimitiveTypes = 4;
          MakeDataUnique((MD5Importer *)this_04,pMVar25);
          __s = (pMVar25->mShader).data;
          std::__cxx11::string::string((string *)&name,__s,(allocator *)&temp);
          std::__cxx11::string::append((char *)&name);
          sVar20 = name._M_string_length;
          if (name._M_string_length < 0x400) {
            (this_00->mName).length = (ai_uint32)name._M_string_length;
            memcpy((this_00->mName).data,name._M_dataplus._M_p,name._M_string_length);
            (this_00->mName).data[sVar20] = '\0';
          }
          uVar29 = (long)(pMVar25->mVertices).
                         super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pMVar25->mVertices).
                         super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4;
          uVar22 = (uint)uVar29;
          this_00->mNumVertices = uVar22;
          uVar29 = uVar29 & 0xffffffff;
          uVar43 = uVar29 * 0xc;
          paVar30 = (aiVector3D *)operator_new__(uVar43);
          if (uVar29 != 0) {
            memset(paVar30,0,((uVar43 - 0xc) - (uVar43 - 0xc) % 0xc) + 0xc);
          }
          this_00->mVertices = paVar30;
          paVar30 = (aiVector3D *)operator_new__(uVar43);
          if (uVar22 != 0) {
            memset(paVar30,0,((uVar43 - 0xc) - (uVar43 - 0xc) % 0xc) + 0xc);
          }
          pBVar44 = meshParser.mJoints.
                    super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pBVar42 = meshParser.mJoints.
                    super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pInput = &pMVar25->mShader;
          this_00->mTextureCoords[0] = paVar30;
          this_00->mNumUVComponents[0] = 2;
          for (pVVar31 = (pMVar25->mVertices).
                         super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pVVar31 !=
              (pMVar25->mVertices).
              super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>.
              _M_impl.super__Vector_impl_data._M_finish; pVVar31 = pVVar31 + 1) {
            paVar30->x = (pVVar31->mUV).x;
            paVar30->y = 1.0 - (pVVar31->mUV).y;
            paVar30->z = 0.0;
            paVar30 = paVar30 + 1;
          }
          uVar29 = ((long)meshParser.mJoints.
                          super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)meshParser.mJoints.
                         super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x4b4;
          __s_00 = operator_new__(-(ulong)(uVar29 >> 0x3e != 0) | uVar29 * 4);
          memset(__s_00,0,uVar29 * 4);
          for (pVVar31 = (pMVar25->mVertices).
                         super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pVVar31 !=
              (pMVar25->mVertices).
              super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>.
              _M_impl.super__Vector_impl_data._M_finish; pVVar31 = pVVar31 + 1) {
            uVar22 = pVVar31->mFirstWeight;
            uVar43 = (ulong)uVar22;
            lVar41 = uVar43 * 0x14 + 4;
            for (; uVar43 < pVVar31->mNumWeights + uVar22; uVar43 = uVar43 + 1) {
              pWVar7 = (pMVar25->mWeights).
                       super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              fVar45 = *(float *)((long)&pWVar7->mBone + lVar41);
              if ((1.1920929e-07 <= fVar45) || (fVar45 < -1.1920929e-07)) {
                piVar2 = (int *)((long)__s_00 + (ulong)*(uint *)((long)pWVar7 + lVar41 + -4) * 4);
                *piVar2 = *piVar2 + 1;
              }
              lVar41 = lVar41 + 0x14;
            }
          }
          for (uVar22 = 0; uVar22 < uVar29; uVar22 = uVar22 + 1) {
            if (*(int *)((long)__s_00 + (ulong)uVar22 * 4) != 0) {
              this_00->mNumBones = this_00->mNumBones + 1;
            }
          }
          if ((ulong)this_00->mNumBones != 0) {
            ppaVar32 = (aiBone **)operator_new__((ulong)this_00->mNumBones << 3);
            this_00->mBones = ppaVar32;
            local_93c = 0;
            for (uVar22 = 0; uVar29 = (ulong)uVar22,
                uVar29 < (ulong)(((long)pBVar44 - (long)pBVar42) / 0x4b4); uVar22 = uVar22 + 1) {
              if (*(int *)((long)__s_00 + uVar29 * 4) != 0) {
                this_01 = (aiBone *)operator_new(0x450);
                aiBone::aiBone(this_01);
                this_00->mBones[local_93c] = this_01;
                uVar39 = *(uint *)((long)__s_00 + uVar29 * 4);
                this_01->mNumWeights = uVar39;
                paVar33 = (aiVertexWeight *)operator_new__((ulong)uVar39 << 3);
                if (uVar39 != 0) {
                  memset(paVar33,0,(ulong)uVar39 << 3);
                }
                pBVar44 = meshParser.mJoints.
                          super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                this_01->mWeights = paVar33;
                pBVar42 = meshParser.mJoints.
                          super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar29;
                uVar39 = (pBVar42->super_BaseJointDescription).mName.length;
                if (0x3fe < uVar39) {
                  uVar39 = 0x3ff;
                }
                uVar43 = (ulong)uVar39;
                temp.length = uVar39;
                memcpy(temp.data,(pBVar42->super_BaseJointDescription).mName.data,uVar43);
                temp.data[uVar43] = '\0';
                (this_01->mName).length = uVar39;
                memcpy((this_01->mName).data,temp.data,uVar43);
                (this_01->mName).data[uVar43] = '\0';
                fVar16 = (pBVar42->mInvTransform).a1;
                fVar17 = (pBVar42->mInvTransform).a2;
                fVar18 = (pBVar42->mInvTransform).a3;
                fVar19 = (pBVar42->mInvTransform).a4;
                fVar45 = (pBVar42->mInvTransform).b1;
                fVar3 = (pBVar42->mInvTransform).b2;
                fVar4 = (pBVar42->mInvTransform).b3;
                fVar8 = (pBVar42->mInvTransform).b4;
                fVar12 = (pBVar42->mInvTransform).c1;
                fVar13 = (pBVar42->mInvTransform).c2;
                fVar14 = (pBVar42->mInvTransform).c3;
                fVar15 = (pBVar42->mInvTransform).c4;
                fVar9 = (pBVar42->mInvTransform).d2;
                fVar10 = (pBVar42->mInvTransform).d3;
                fVar11 = (pBVar42->mInvTransform).d4;
                (this_01->mOffsetMatrix).d1 = (pBVar42->mInvTransform).d1;
                (this_01->mOffsetMatrix).d2 = fVar9;
                (this_01->mOffsetMatrix).d3 = fVar10;
                (this_01->mOffsetMatrix).d4 = fVar11;
                (this_01->mOffsetMatrix).c1 = fVar12;
                (this_01->mOffsetMatrix).c2 = fVar13;
                (this_01->mOffsetMatrix).c3 = fVar14;
                (this_01->mOffsetMatrix).c4 = fVar15;
                (this_01->mOffsetMatrix).b1 = fVar45;
                (this_01->mOffsetMatrix).b2 = fVar3;
                (this_01->mOffsetMatrix).b3 = fVar4;
                (this_01->mOffsetMatrix).b4 = fVar8;
                (this_01->mOffsetMatrix).a1 = fVar16;
                (this_01->mOffsetMatrix).a2 = fVar17;
                (this_01->mOffsetMatrix).a3 = fVar18;
                (this_01->mOffsetMatrix).a4 = fVar19;
                pBVar42->mMap = local_93c;
                MD5::ConvertQuaternion
                          (&pBVar44[uVar29].mRotationQuat,&pBVar44[uVar29].mRotationQuatConverted);
                local_93c = local_93c + 1;
                pBVar42 = meshParser.mJoints.
                          super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pBVar44 = meshParser.mJoints.
                          super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
            }
            local_918 = this_00->mVertices;
            for (pVVar31 = (pMVar25->mVertices).
                           super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                pVVar31 !=
                (pMVar25->mVertices).
                super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                ._M_impl.super__Vector_impl_data._M_finish; pVVar31 = pVVar31 + 1) {
              local_918->x = 0.0;
              local_918->y = 0.0;
              local_918->z = 0.0;
              uVar22 = pVVar31->mFirstWeight;
              uVar43 = (ulong)uVar22;
              uVar39 = pVVar31->mNumWeights;
              lVar41 = uVar43 * 0x14 + 4;
              fVar45 = 0.0;
              for (uVar29 = uVar43; uVar29 < uVar22 + uVar39; uVar29 = uVar29 + 1) {
                fVar45 = fVar45 + *(float *)((long)&((pMVar25->mWeights).
                                                                                                          
                                                  super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->mBone
                                            + lVar41);
                lVar41 = lVar41 + 0x14;
              }
              if ((fVar45 != 0.0) || (NAN(fVar45))) {
                lVar41 = uVar43 * 0x14 + 8;
                for (; pBVar42 = meshParser.mJoints.
                                 super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                 ._M_impl.super__Vector_impl_data._M_start, uVar43 < uVar22 + uVar39
                    ; uVar43 = uVar43 + 1) {
                  pWVar7 = (pMVar25->mWeights).
                           super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  lVar34 = (long)(pMVar25->mWeights).
                                 super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pWVar7;
                  if ((ulong)(lVar34 / 0x14) <= uVar43) {
                    this_03 = (DeadlyImportError *)__cxa_allocate_exception(0x10,0x14,lVar34 % 0x14)
                    ;
                    std::__cxx11::string::string
                              ((string *)&temp,"MD5MESH: Invalid weight index",
                               (allocator *)local_438);
                    DeadlyImportError::DeadlyImportError(this_03,(string *)&temp);
                    __cxa_throw(this_03,&DeadlyImportError::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  fVar3 = *(float *)((long)pWVar7 + lVar41 + -4);
                  if ((1.1920929e-07 <= fVar3) || (fVar3 < -1.1920929e-07)) {
                    uVar39 = *(uint *)((long)pWVar7 + lVar41 + -8);
                    aVar46 = aiQuaterniont<float>::Rotate
                                       (&meshParser.mJoints.
                                         super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar39].
                                         mRotationQuatConverted,
                                        (aiVector3t<float> *)((long)&pWVar7->mBone + lVar41));
                    temp.data._4_4_ = aVar46.z;
                    temp._0_8_ = aVar46._0_8_;
                    aVar46 = ::operator+(&pBVar42[uVar39].mPositionXYZ,(aiVector3t<float> *)&temp);
                    fVar4 = *(float *)((long)pWVar7 + lVar41 + -4);
                    local_438[0].z = aVar46.z * fVar4;
                    local_438[0].y = aVar46.y * fVar4;
                    local_438[0].x = aVar46.x * fVar4;
                    aiVector3t<float>::operator+=(local_918,local_438);
                    paVar30 = this_00->mVertices;
                    paVar33 = this_00->mBones[pBVar42[uVar39].mMap]->mWeights;
                    this_00->mBones[pBVar42[uVar39].mMap]->mWeights = paVar33 + 1;
                    paVar33->mVertexId = (uint)(((long)local_918 - (long)paVar30) / 0xc);
                    paVar33->mWeight = fVar3 / fVar45;
                    uVar39 = pVVar31->mNumWeights;
                  }
                  lVar41 = lVar41 + 0x14;
                }
              }
              else {
                pLVar35 = DefaultLogger::get();
                Logger::error(pLVar35,"MD5MESH: The sum of all vertex bone weights is 0");
              }
              local_918 = local_918 + 1;
            }
            for (uVar29 = 0; uVar29 < this_00->mNumBones; uVar29 = uVar29 + 1) {
              ppaVar1 = &this_00->mBones[uVar29]->mWeights;
              *ppaVar1 = *ppaVar1 + -(ulong)this_00->mBones[uVar29]->mNumWeights;
            }
          }
          operator_delete__(__s_00);
          uVar29 = (long)(pMVar25->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(pMVar25->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 4;
          this_00->mNumFaces = (uint)uVar29;
          uVar43 = uVar29 & 0xffffffff;
          puVar36 = (ulong *)operator_new__(uVar43 * 0x10 + 8);
          *puVar36 = uVar43;
          paVar37 = (aiFace *)(puVar36 + 1);
          if (uVar43 != 0) {
            paVar40 = paVar37;
            do {
              paVar40->mNumIndices = 0;
              paVar40->mIndices = (uint *)0x0;
              paVar40 = paVar40 + 1;
            } while (paVar40 != paVar37 + uVar43);
          }
          this_00->mFaces = paVar37;
          lVar41 = 0;
          for (uVar43 = 0; uVar43 < (uVar29 & 0xffffffff); uVar43 = uVar43 + 1) {
            *(undefined4 *)((long)&this_00->mFaces->mNumIndices + lVar41) = 3;
            *(undefined8 *)((long)&this_00->mFaces->mIndices + lVar41) =
                 *(undefined8 *)
                  ((long)&((pMVar25->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                           _M_impl.super__Vector_impl_data._M_start)->mIndices + lVar41);
            *(undefined8 *)
             ((long)&((pMVar25->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                      super__Vector_impl_data._M_start)->mIndices + lVar41) = 0;
            uVar29 = (ulong)this_00->mNumFaces;
            lVar41 = lVar41 + 0x10;
          }
          this_02 = (aiMaterial *)operator_new(0x10);
          aiMaterial::aiMaterial(this_02);
          this->pScene->mMaterials[local_924] = this_02;
          uVar22 = pInput->length;
          if (uVar22 == 0) {
LAB_0041720d:
            aiMaterial::AddProperty(this_02,pInput,"$tex.file",1,0);
          }
          else {
            pcVar38 = strchr(__s,0x2e);
            if (pcVar38 != (char *)0x0) goto LAB_0041720d;
            if (0x3fe < uVar22) {
              uVar22 = 0x3ff;
            }
            temp.length = uVar22;
            memcpy(temp.data,__s,(ulong)uVar22);
            temp.data[uVar22] = '\0';
            aiString::Append(&temp,"_local.tga");
            aiMaterial::AddProperty(this_02,&temp,"$tex.file",6,0);
            fVar45 = (float)pInput->length;
            if (0x3fe < pInput->length) {
              fVar45 = 1.43353e-42;
            }
            uVar29 = (ulong)(uint)fVar45;
            local_438[0].x = fVar45;
            memcpy(&local_438[0].y,__s,uVar29);
            *(undefined1 *)((long)&local_438[0].y + uVar29) = 0;
            temp.length = (ai_uint32)fVar45;
            memcpy(temp.data,&local_438[0].y,uVar29);
            temp.data[uVar29] = '\0';
            aiString::Append(&temp,"_s.tga");
            aiMaterial::AddProperty(this_02,&temp,"$tex.file",2,0);
            fVar45 = (float)pInput->length;
            if (0x3fe < pInput->length) {
              fVar45 = 1.43353e-42;
            }
            uVar29 = (ulong)(uint)fVar45;
            local_438[0].x = fVar45;
            memcpy(&local_438[0].y,__s,uVar29);
            *(undefined1 *)((long)&local_438[0].y + uVar29) = 0;
            temp.length = (ai_uint32)fVar45;
            memcpy(temp.data,&local_438[0].y,uVar29);
            temp.data[uVar29] = '\0';
            aiString::Append(&temp,"_d.tga");
            aiMaterial::AddProperty(this_02,&temp,"$tex.file",1,0);
            fVar45 = (float)pInput->length;
            if (0x3fe < pInput->length) {
              fVar45 = 1.43353e-42;
            }
            uVar29 = (ulong)(uint)fVar45;
            local_438[0].x = fVar45;
            memcpy(&local_438[0].y,__s,uVar29);
            *(undefined1 *)((long)&local_438[0].y + uVar29) = 0;
            temp.length = (ai_uint32)fVar45;
            memcpy(temp.data,&local_438[0].y,uVar29);
            temp.data[uVar29] = '\0';
            aiString::Append(&temp,"_h.tga");
            aiMaterial::AddProperty(this_02,&temp,"$tex.file",5,0);
            aiMaterial::AddProperty(this_02,pInput,"?mat.name",0,0);
          }
          this_00->mMaterialIndex = local_924;
          local_924 = local_924 + 1;
          std::__cxx11::string::~string((string *)&name);
        }
        pMVar25 = pMVar25 + 1;
      }
      MD5::MD5MeshParser::~MD5MeshParser(&meshParser);
      std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>::~vector
                (&parser.mSections);
      goto LAB_004174a0;
    }
  }
  pLVar35 = DefaultLogger::get();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp,
                 "Failed to access MD5MESH file: ",&pFile);
  Logger::warn(pLVar35,(char *)temp._0_8_);
  std::__cxx11::string::~string((string *)&temp);
LAB_004174a0:
  if (file != (IOStream *)0x0) {
    (*file->_vptr_IOStream[1])(file);
  }
  std::__cxx11::string::~string((string *)&pFile);
  return;
}

Assistant:

void MD5Importer::LoadMD5MeshFile ()
{
    std::string pFile = mFile + "md5mesh";
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == NULL || !file->FileSize())    {
        ASSIMP_LOG_WARN("Failed to access MD5MESH file: " + pFile);
        return;
    }
    bHadMD5Mesh = true;
    LoadFileIntoMemory(file.get());

    // now construct a parser and parse the file
    MD5::MD5Parser parser(mBuffer,fileSize);

    // load the mesh information from it
    MD5::MD5MeshParser meshParser(parser.mSections);

    // create the bone hierarchy - first the root node and dummy nodes for all meshes
    pScene->mRootNode = new aiNode("<MD5_Root>");
    pScene->mRootNode->mNumChildren = 2;
    pScene->mRootNode->mChildren = new aiNode*[2];

    // build the hierarchy from the MD5MESH file
    aiNode* pcNode = pScene->mRootNode->mChildren[1] = new aiNode();
    pcNode->mName.Set("<MD5_Hierarchy>");
    pcNode->mParent = pScene->mRootNode;
    AttachChilds_Mesh(-1,pcNode,meshParser.mJoints);

    pcNode = pScene->mRootNode->mChildren[0] = new aiNode();
    pcNode->mName.Set("<MD5_Mesh>");
    pcNode->mParent = pScene->mRootNode;

#if 0
    if (pScene->mRootNode->mChildren[1]->mNumChildren) /* start at the right hierarchy level */
        SkeletonMeshBuilder skeleton_maker(pScene,pScene->mRootNode->mChildren[1]->mChildren[0]);
#else

    // FIX: MD5 files exported from Blender can have empty meshes
    for (std::vector<MD5::MeshDesc>::const_iterator it  = meshParser.mMeshes.begin(),end = meshParser.mMeshes.end(); it != end;++it) {
        if (!(*it).mFaces.empty() && !(*it).mVertices.empty())
            ++pScene->mNumMaterials;
    }

    // generate all meshes
    pScene->mNumMeshes = pScene->mNumMaterials;
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    pScene->mMaterials = new aiMaterial*[pScene->mNumMeshes];

    //  storage for node mesh indices
    pcNode->mNumMeshes = pScene->mNumMeshes;
    pcNode->mMeshes = new unsigned int[pcNode->mNumMeshes];
    for (unsigned int m = 0; m < pcNode->mNumMeshes;++m)
        pcNode->mMeshes[m] = m;

    unsigned int n = 0;
    for (std::vector<MD5::MeshDesc>::iterator it  = meshParser.mMeshes.begin(),end = meshParser.mMeshes.end(); it != end;++it) {
        MD5::MeshDesc& meshSrc = *it;
        if (meshSrc.mFaces.empty() || meshSrc.mVertices.empty())
            continue;

        aiMesh* mesh = pScene->mMeshes[n] = new aiMesh();
        mesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

        // generate unique vertices in our internal verbose format
        MakeDataUnique(meshSrc);

        std::string name( meshSrc.mShader.C_Str() );
        name += ".msh";
        mesh->mName = name;
        mesh->mNumVertices = (unsigned int) meshSrc.mVertices.size();
        mesh->mVertices = new aiVector3D[mesh->mNumVertices];
        mesh->mTextureCoords[0] = new aiVector3D[mesh->mNumVertices];
        mesh->mNumUVComponents[0] = 2;

        // copy texture coordinates
        aiVector3D* pv = mesh->mTextureCoords[0];
        for (MD5::VertexList::const_iterator iter =  meshSrc.mVertices.begin();iter != meshSrc.mVertices.end();++iter,++pv) {
            pv->x = (*iter).mUV.x;
            pv->y = 1.0f-(*iter).mUV.y; // D3D to OpenGL
            pv->z = 0.0f;
        }

        // sort all bone weights - per bone
        unsigned int* piCount = new unsigned int[meshParser.mJoints.size()];
        ::memset(piCount,0,sizeof(unsigned int)*meshParser.mJoints.size());

        for (MD5::VertexList::const_iterator iter =  meshSrc.mVertices.begin();iter != meshSrc.mVertices.end();++iter,++pv) {
            for (unsigned int jub = (*iter).mFirstWeight, w = jub; w < jub + (*iter).mNumWeights;++w)
            {
                MD5::WeightDesc& weightDesc = meshSrc.mWeights[w];
                /* FIX for some invalid exporters */
                if (!(weightDesc.mWeight < AI_MD5_WEIGHT_EPSILON && weightDesc.mWeight >= -AI_MD5_WEIGHT_EPSILON ))
                    ++piCount[weightDesc.mBone];
            }
        }

        // check how many we will need
        for (unsigned int p = 0; p < meshParser.mJoints.size();++p)
            if (piCount[p])mesh->mNumBones++;

        if (mesh->mNumBones) // just for safety
        {
            mesh->mBones = new aiBone*[mesh->mNumBones];
            for (unsigned int q = 0,h = 0; q < meshParser.mJoints.size();++q)
            {
                if (!piCount[q])continue;
                aiBone* p = mesh->mBones[h] = new aiBone();
                p->mNumWeights = piCount[q];
                p->mWeights = new aiVertexWeight[p->mNumWeights];
                p->mName = aiString(meshParser.mJoints[q].mName);
                p->mOffsetMatrix = meshParser.mJoints[q].mInvTransform;

                // store the index for later use
                MD5::BoneDesc& boneSrc = meshParser.mJoints[q];
                boneSrc.mMap = h++;

                // compute w-component of quaternion
                MD5::ConvertQuaternion( boneSrc.mRotationQuat, boneSrc.mRotationQuatConverted );
            }

            pv = mesh->mVertices;
            for (MD5::VertexList::const_iterator iter =  meshSrc.mVertices.begin();iter != meshSrc.mVertices.end();++iter,++pv) {
                // compute the final vertex position from all single weights
                *pv = aiVector3D();

                // there are models which have weights which don't sum to 1 ...
                ai_real fSum = 0.0;
                for (unsigned int jub = (*iter).mFirstWeight, w = jub; w < jub + (*iter).mNumWeights;++w)
                    fSum += meshSrc.mWeights[w].mWeight;
                if (!fSum) {
                    ASSIMP_LOG_ERROR("MD5MESH: The sum of all vertex bone weights is 0");
                    continue;
                }

                // process bone weights
                for (unsigned int jub = (*iter).mFirstWeight, w = jub; w < jub + (*iter).mNumWeights;++w)   {
                    if (w >= meshSrc.mWeights.size())
                        throw DeadlyImportError("MD5MESH: Invalid weight index");

                    MD5::WeightDesc& weightDesc = meshSrc.mWeights[w];
                    if ( weightDesc.mWeight < AI_MD5_WEIGHT_EPSILON && weightDesc.mWeight >= -AI_MD5_WEIGHT_EPSILON) {
                        continue;
                    }

                    const ai_real fNewWeight = weightDesc.mWeight / fSum;

                    // transform the local position into worldspace
                    MD5::BoneDesc& boneSrc = meshParser.mJoints[weightDesc.mBone];
                    const aiVector3D v = boneSrc.mRotationQuatConverted.Rotate (weightDesc.vOffsetPosition);

                    // use the original weight to compute the vertex position
                    // (some MD5s seem to depend on the invalid weight values ...)
                    *pv += ((boneSrc.mPositionXYZ+v)* (ai_real)weightDesc.mWeight);

                    aiBone* bone = mesh->mBones[boneSrc.mMap];
                    *bone->mWeights++ = aiVertexWeight((unsigned int)(pv-mesh->mVertices),fNewWeight);
                }
            }

            // undo our nice offset tricks ...
            for (unsigned int p = 0; p < mesh->mNumBones;++p) {
                mesh->mBones[p]->mWeights -= mesh->mBones[p]->mNumWeights;
            }
        }

        delete[] piCount;

        // now setup all faces - we can directly copy the list
        // (however, take care that the aiFace destructor doesn't delete the mIndices array)
        mesh->mNumFaces = (unsigned int)meshSrc.mFaces.size();
        mesh->mFaces = new aiFace[mesh->mNumFaces];
        for (unsigned int c = 0; c < mesh->mNumFaces;++c)   {
            mesh->mFaces[c].mNumIndices = 3;
            mesh->mFaces[c].mIndices = meshSrc.mFaces[c].mIndices;
            meshSrc.mFaces[c].mIndices = NULL;
        }

        // generate a material for the mesh
        aiMaterial* mat = new aiMaterial();
        pScene->mMaterials[n] = mat;

        // insert the typical doom3 textures:
        // nnn_local.tga  - normal map
        // nnn_h.tga      - height map
        // nnn_s.tga      - specular map
        // nnn_d.tga      - diffuse map
        if (meshSrc.mShader.length && !strchr(meshSrc.mShader.data,'.')) {

            aiString temp(meshSrc.mShader);
            temp.Append("_local.tga");
            mat->AddProperty(&temp,AI_MATKEY_TEXTURE_NORMALS(0));

            temp =  aiString(meshSrc.mShader);
            temp.Append("_s.tga");
            mat->AddProperty(&temp,AI_MATKEY_TEXTURE_SPECULAR(0));

            temp =  aiString(meshSrc.mShader);
            temp.Append("_d.tga");
            mat->AddProperty(&temp,AI_MATKEY_TEXTURE_DIFFUSE(0));

            temp =  aiString(meshSrc.mShader);
            temp.Append("_h.tga");
            mat->AddProperty(&temp,AI_MATKEY_TEXTURE_HEIGHT(0));

            // set this also as material name
            mat->AddProperty(&meshSrc.mShader,AI_MATKEY_NAME);
        }
        else {
            mat->AddProperty(&meshSrc.mShader, AI_MATKEY_TEXTURE_DIFFUSE(0));
        }
        mesh->mMaterialIndex = n++;
    }
#endif
}